

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::ReductionParameter::set_operation
          (ReductionParameter *this,ReductionParameter_ReductionOp value)

{
  if (value - ReductionParameter_ReductionOp_SUM < 4) {
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
    this->operation_ = value;
    return;
  }
  __assert_fail("::caffe::ReductionParameter_ReductionOp_IsValid(value)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/include/caffe/proto/caffe.pb.h"
                ,0x53d1,
                "void caffe::ReductionParameter::set_operation(::caffe::ReductionParameter_ReductionOp)"
               );
}

Assistant:

bool ReductionParameter_ReductionOp_IsValid(int value) {
  switch (value) {
    case 1:
    case 2:
    case 3:
    case 4:
      return true;
    default:
      return false;
  }
}